

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

void __thiscall cmCTest::Log(cmCTest *this,int logType,char *file,int line,char *msg,bool suppress)

{
  char cVar1;
  __uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_> _Var2;
  ostream *poVar3;
  _Head_base<0UL,_cmCTest::Private_*,_false> _Var4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  ostream *poVar6;
  long lVar7;
  char *pcVar8;
  allocator<char> local_51;
  string msg_str;
  
  if (msg == (char *)0x0) {
    return;
  }
  if (logType != 7 && suppress) {
    return;
  }
  if (*msg == '\0') {
    return;
  }
  _Var4._M_head_impl =
       (this->Impl)._M_t.
       super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
       super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
       super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
  if (logType == 3) {
    if ((_Var4._M_head_impl)->Debug != false) {
      return;
    }
    if ((_Var4._M_head_impl)->ExtraVerbose != false) {
      return;
    }
  }
  _Var2._M_t.
  super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
  super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl =
       *(tuple<cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_> *)
        &((_Var4._M_head_impl)->OutputLogFile)._M_t;
  if ((__uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>)
      _Var2._M_t.
      super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>.
      super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>)0x0) {
    if (logType == 0) {
      lVar7 = 0x29c1;
LAB_00441d41:
      if (*(char *)((long)&(_Var4._M_head_impl)->RepeatCount + lVar7) != '\x01') goto LAB_00441e34;
    }
    else if ((logType == 5) && ((_Var4._M_head_impl)->Debug == false)) {
      lVar7 = 0x53;
      goto LAB_00441d41;
    }
    if ((_Var4._M_head_impl)->ShowLineNumbers == true) {
      poVar3 = std::endl<char,std::char_traits<char>>
                         ((ostream *)
                          _Var2._M_t.
                          super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                          .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl);
      poVar3 = std::operator<<(poVar3,file);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,line);
      std::operator<<(poVar3," ");
      _Var4._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    }
    if ((_Var4._M_head_impl)->OutputLogFileLastTag != logType) {
      std::operator<<((ostream *)
                      ((_Var4._M_head_impl)->OutputLogFile)._M_t.
                      super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                      ,"[");
      if ((uint)logType < 8) {
        pcVar8 = cmCTestStringLogType[(uint)logType];
      }
      else {
        pcVar8 = "OTHER";
      }
      std::operator<<((ostream *)
                      (((this->Impl)._M_t.
                        super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                        .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                      OutputLogFile)._M_t,pcVar8);
      poVar3 = std::operator<<((ostream *)
                               (((this->Impl)._M_t.
                                 super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>
                                 .super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->
                               OutputLogFile)._M_t,"] ");
      std::endl<char,std::char_traits<char>>(poVar3);
      _Var4._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    }
    std::operator<<((ostream *)
                    ((_Var4._M_head_impl)->OutputLogFile)._M_t.
                    super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                    ._M_t,msg);
    std::ostream::flush();
    _Var4._M_head_impl =
         (this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
    if ((_Var4._M_head_impl)->OutputLogFileLastTag != logType) {
      std::endl<char,std::char_traits<char>>
                ((ostream *)
                 ((_Var4._M_head_impl)->OutputLogFile)._M_t.
                 super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                );
      _Var4._M_head_impl =
           (this->Impl)._M_t.
           super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
           super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
           super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      (_Var4._M_head_impl)->OutputLogFileLastTag = logType;
    }
  }
LAB_00441e34:
  if ((_Var4._M_head_impl)->Quiet != false) {
    return;
  }
  poVar3 = (_Var4._M_head_impl)->StreamOut;
  if (7 < (uint)logType) goto switchD_00441e72_caseD_3;
  poVar6 = (_Var4._M_head_impl)->StreamErr;
  switch((ulong)(uint)logType) {
  case 0:
    cVar1 = (_Var4._M_head_impl)->Debug;
    goto joined_r0x0044206b;
  case 3:
    break;
  case 4:
    if ((_Var4._M_head_impl)->TestProgressOutput == true) {
      if ((_Var4._M_head_impl)->ShowLineNumbers == true) {
        poVar6 = std::endl<char,std::char_traits<char>>(poVar3);
        poVar6 = std::operator<<(poVar6,file);
        poVar6 = std::operator<<(poVar6,":");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,line);
        std::operator<<(poVar6," ");
        _Var4._M_head_impl =
             (this->Impl)._M_t.
             super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
             super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
             super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl;
      }
      if ((_Var4._M_head_impl)->FlushTestProgressLine == true) {
        putchar(0xd);
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->FlushTestProgressLine =
             false;
        std::ostream::flush();
      }
      std::__cxx11::string::string<std::allocator<char>>((string *)&msg_str,msg,&local_51);
      lVar7 = std::__cxx11::string::find((char)&msg_str,10);
      if (lVar7 != -1) {
        ((this->Impl)._M_t.
         super___uniq_ptr_impl<cmCTest::Private,_std::default_delete<cmCTest::Private>_>._M_t.
         super__Tuple_impl<0UL,_cmCTest::Private_*,_std::default_delete<cmCTest::Private>_>.
         super__Head_base<0UL,_cmCTest::Private_*,_false>._M_head_impl)->FlushTestProgressLine =
             true;
        local_51 = (allocator<char>)0xa;
        _Var5 = std::
                __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )msg_str._M_dataplus._M_p,
                           (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            )(msg_str._M_dataplus._M_p + msg_str._M_string_length),
                           (_Iter_equals_val<const_char>)&local_51);
        std::__cxx11::string::erase
                  (&msg_str,_Var5._M_current,msg_str._M_dataplus._M_p + msg_str._M_string_length);
      }
      std::operator<<(poVar3,(string *)&msg_str);
      printf("\x1b[K");
      std::ostream::flush();
      std::__cxx11::string::~string((string *)&msg_str);
      return;
    }
  default:
    if ((_Var4._M_head_impl)->Debug == false) {
      cVar1 = (_Var4._M_head_impl)->Verbose;
joined_r0x0044206b:
      if (cVar1 != '\x01') {
        return;
      }
    }
    break;
  case 5:
    if ((_Var4._M_head_impl)->Debug == false) {
      cVar1 = (_Var4._M_head_impl)->ExtraVerbose;
      goto joined_r0x0044206b;
    }
    break;
  case 6:
    if ((_Var4._M_head_impl)->ShowLineNumbers == true) {
      poVar3 = std::endl<char,std::char_traits<char>>(poVar6);
      poVar3 = std::operator<<(poVar3,file);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,line);
      std::operator<<(poVar3," ");
    }
    std::operator<<(poVar6,msg);
    goto LAB_004420cc;
  case 7:
    if ((_Var4._M_head_impl)->ShowLineNumbers == true) {
      poVar3 = std::endl<char,std::char_traits<char>>(poVar6);
      poVar3 = std::operator<<(poVar3,file);
      poVar3 = std::operator<<(poVar3,":");
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,line);
      std::operator<<(poVar3," ");
    }
    std::operator<<(poVar6,msg);
    std::ostream::flush();
    cmSystemTools::s_ErrorOccurred = true;
    return;
  }
switchD_00441e72_caseD_3:
  if ((_Var4._M_head_impl)->ShowLineNumbers == true) {
    poVar6 = std::endl<char,std::char_traits<char>>(poVar3);
    poVar6 = std::operator<<(poVar6,file);
    poVar6 = std::operator<<(poVar6,":");
    poVar6 = (ostream *)std::ostream::operator<<(poVar6,line);
    std::operator<<(poVar6," ");
  }
  std::operator<<(poVar3,msg);
LAB_004420cc:
  std::ostream::flush();
  return;
}

Assistant:

void cmCTest::Log(int logType, const char* file, int line, const char* msg,
                  bool suppress)
{
  if (!msg || !*msg) {
    return;
  }
  if (suppress && logType != cmCTest::ERROR_MESSAGE) {
    return;
  }
  if (logType == cmCTest::HANDLER_PROGRESS_OUTPUT &&
      (this->Impl->Debug || this->Impl->ExtraVerbose)) {
    return;
  }
  if (this->Impl->OutputLogFile) {
    bool display = true;
    if (logType == cmCTest::DEBUG && !this->Impl->Debug) {
      display = false;
    }
    if (logType == cmCTest::HANDLER_VERBOSE_OUTPUT && !this->Impl->Debug &&
        !this->Impl->ExtraVerbose) {
      display = false;
    }
    if (display) {
      cmCTestLogOutputFileLine(*this->Impl->OutputLogFile);
      if (logType != this->Impl->OutputLogFileLastTag) {
        *this->Impl->OutputLogFile << "[";
        if (logType >= OTHER || logType < 0) {
          *this->Impl->OutputLogFile << "OTHER";
        } else {
          *this->Impl->OutputLogFile << cmCTestStringLogType[logType];
        }
        *this->Impl->OutputLogFile << "] " << std::endl;
      }
      *this->Impl->OutputLogFile << msg << std::flush;
      if (logType != this->Impl->OutputLogFileLastTag) {
        *this->Impl->OutputLogFile << std::endl;
        this->Impl->OutputLogFileLastTag = logType;
      }
    }
  }
  if (!this->Impl->Quiet) {
    std::ostream& out = *this->Impl->StreamOut;
    std::ostream& err = *this->Impl->StreamErr;

    if (logType == HANDLER_TEST_PROGRESS_OUTPUT) {
      if (this->Impl->TestProgressOutput) {
        cmCTestLogOutputFileLine(out);
        if (this->Impl->FlushTestProgressLine) {
          printf("\r");
          this->Impl->FlushTestProgressLine = false;
          out.flush();
        }

        std::string msg_str{ msg };
        auto const lineBreakIt = msg_str.find('\n');
        if (lineBreakIt != std::string::npos) {
          this->Impl->FlushTestProgressLine = true;
          msg_str.erase(std::remove(msg_str.begin(), msg_str.end(), '\n'),
                        msg_str.end());
        }

        out << msg_str;
#ifndef _WIN32
        printf("\x1B[K"); // move caret to end
#endif
        out.flush();
        return;
      }
      logType = HANDLER_OUTPUT;
    }

    switch (logType) {
      case DEBUG:
        if (this->Impl->Debug) {
          cmCTestLogOutputFileLine(out);
          out << msg;
          out.flush();
        }
        break;
      case OUTPUT:
      case HANDLER_OUTPUT:
        if (this->Impl->Debug || this->Impl->Verbose) {
          cmCTestLogOutputFileLine(out);
          out << msg;
          out.flush();
        }
        break;
      case HANDLER_VERBOSE_OUTPUT:
        if (this->Impl->Debug || this->Impl->ExtraVerbose) {
          cmCTestLogOutputFileLine(out);
          out << msg;
          out.flush();
        }
        break;
      case WARNING:
        cmCTestLogOutputFileLine(err);
        err << msg;
        err.flush();
        break;
      case ERROR_MESSAGE:
        cmCTestLogOutputFileLine(err);
        err << msg;
        err.flush();
        cmSystemTools::SetErrorOccurred();
        break;
      default:
        cmCTestLogOutputFileLine(out);
        out << msg;
        out.flush();
    }
  }
}